

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntMap.h
# Opt level: O2

void __thiscall
Minisat::IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::insert
          (IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_> *this,int key,lbool val)

{
  lbool *plVar1;
  
  reserve(this,key);
  plVar1 = operator[](this,key);
  plVar1->value = val.value;
  return;
}

Assistant:

void     insert (K key, V val)       { reserve(key); operator[](key) = val; }